

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O1

void ntru_round3(uint16_t *out,uint16_t *in,uint p,uint q)

{
  ulong uVar1;
  short sVar2;
  uint uVar3;
  
  ntru_mod3(out,in,p,q);
  if (p != 0) {
    uVar1 = 0;
    do {
      uVar3 = (uint)in[uVar1] + (q >> 1);
      sVar2 = (short)uVar3 -
              (short)(SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x1000000000000)) / ZEXT416(q & 0xffff),0
                            ) * (ulong)uVar3 >> 0x30) * (short)q;
      uVar3 = q;
      if ((short)(sVar2 - (short)q) < 0) {
        uVar3 = 0;
      }
      out[uVar1] = (sVar2 - (short)uVar3) - (out[uVar1] + (short)(q >> 1));
      uVar1 = uVar1 + 1;
    } while (p != uVar1);
  }
  return;
}

Assistant:

void ntru_round3(uint16_t *out, const uint16_t *in, unsigned p, unsigned q)
{
    SETUP;
    unsigned bias = q/2;
    ntru_mod3(out, in, p, q);
    for (unsigned i = 0; i < p; i++)
        out[i] = REDUCE(in[i] + bias) - bias - out[i];
}